

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_extract(char *zipname,char *dir,_func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  mz_bool mVar1;
  mz_uint mVar2;
  int iVar3;
  size_t sStack_10308;
  mz_uint32 xattr;
  size_t dirlen;
  mz_zip_archive_file_stat info;
  mz_zip_archive zip_archive;
  char symlink_to [32768];
  char path [32768];
  mz_uint local_38;
  mz_uint n;
  mz_uint i;
  int status;
  void *arg_local;
  _func_int_char_ptr_void_ptr *on_extract_local;
  char *dir_local;
  char *zipname_local;
  
  n = 0xffffffff;
  memset(symlink_to + 0x7ff8,0,0x8000);
  memset(&zip_archive.m_pState,0,0x8000);
  memset(info.m_comment + 0xf8,0,0x70);
  if (&stack0x00000000 == (undefined1 *)0x100b8) {
    zipname_local._4_4_ = 0xffffffff;
  }
  else if ((zipname == (char *)0x0) || (dir == (char *)0x0)) {
    zipname_local._4_4_ = 0xffffffff;
  }
  else {
    sStack_10308 = strlen(dir);
    if (sStack_10308 + 1 < 0x8000) {
      mVar1 = mz_zip_reader_init_file((mz_zip_archive *)(info.m_comment + 0xf8),zipname,0);
      if (mVar1 == 0) {
        zipname_local._4_4_ = 0xffffffff;
      }
      else {
        memset(&dirlen,0,0x248);
        strcpy(symlink_to + 0x7ff8,dir);
        if ((symlink_to[sStack_10308 + 0x7ff7] != '/') &&
           (symlink_to[sStack_10308 + 0x7ff7] != '\\')) {
          symlink_to[sStack_10308 + 0x7ff8] = '/';
          sStack_10308 = sStack_10308 + 1;
        }
        mVar2 = mz_zip_reader_get_num_files((mz_zip_archive *)(info.m_comment + 0xf8));
        for (local_38 = 0; local_38 < mVar2; local_38 = local_38 + 1) {
          mVar1 = mz_zip_reader_file_stat
                            ((mz_zip_archive *)(info.m_comment + 0xf8),local_38,
                             (mz_zip_archive_file_stat *)&dirlen);
          if (mVar1 == 0) goto LAB_00586a84;
          strncpy(symlink_to + sStack_10308 + 0x7ff8,(char *)((long)&info.m_local_header_ofs + 4),
                  0x7fff - sStack_10308);
          iVar3 = mkpath(symlink_to + 0x7ff8);
          if (iVar3 < 0) goto LAB_00586a84;
          if ((((int)(uint)(ushort)info.m_file_index >> 8 == 3) ||
              ((int)(uint)(ushort)info.m_file_index >> 8 == 0x13)) &&
             ((info.m_uncomp_size._4_4_ & 0x20000000) != 0)) {
            if ((0x7fff < info.m_comp_size) ||
               (mVar1 = mz_zip_reader_extract_to_mem_no_alloc
                                  ((mz_zip_archive *)(info.m_comment + 0xf8),local_38,
                                   &zip_archive.m_pState,0x7fff,0,(void *)0x0,0), mVar1 == 0))
            goto LAB_00586a84;
            symlink_to[info.m_comp_size - 8] = '\0';
            iVar3 = symlink((char *)&zip_archive.m_pState,symlink_to + 0x7ff8);
            if (iVar3 != 0) goto LAB_00586a84;
          }
          else {
            mVar1 = mz_zip_reader_is_file_a_directory
                              ((mz_zip_archive *)(info.m_comment + 0xf8),local_38);
            if (((mVar1 == 0) &&
                (mVar1 = mz_zip_reader_extract_to_file
                                   ((mz_zip_archive *)(info.m_comment + 0xf8),local_38,
                                    symlink_to + 0x7ff8,0), mVar1 == 0)) ||
               ((info.m_uncomp_size._4_4_ >> 0x10 != 0 &&
                (iVar3 = chmod(symlink_to + 0x7ff8,info.m_uncomp_size._4_4_ >> 0x10), iVar3 < 0))))
            goto LAB_00586a84;
          }
          if ((on_extract != (_func_int_char_ptr_void_ptr *)0x0) &&
             (iVar3 = (*on_extract)(symlink_to + 0x7ff8,arg), iVar3 < 0)) goto LAB_00586a84;
        }
        n = 0;
LAB_00586a84:
        mVar1 = mz_zip_reader_end((mz_zip_archive *)(info.m_comment + 0xf8));
        if (mVar1 == 0) {
          n = 0xffffffff;
        }
        zipname_local._4_4_ = n;
      }
    }
    else {
      zipname_local._4_4_ = 0xffffffff;
    }
  }
  return zipname_local._4_4_;
}

Assistant:

int zip_extract(const char *zipname, const char *dir,
                int (*on_extract)(const char *filename, void *arg), void *arg) {
  int status = -1;
  mz_uint i, n;
  char path[MAX_PATH + 1];
  char symlink_to[MAX_PATH + 1];
  mz_zip_archive zip_archive;
  mz_zip_archive_file_stat info;
  size_t dirlen = 0;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!zipname || !dir) {
    // Cannot parse zip archive name
    return -1;
  }

  dirlen = strlen(dir);
  if (dirlen + 1 > MAX_PATH) {
    return -1;
  }

  // Now try to open the archive.
  if (!mz_zip_reader_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive reader
    return -1;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MAX_PATH, dir);
#else
  strcpy(path, dir);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(&zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(&zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      goto out;
    }
#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], MAX_PATH - dirlen, info.m_filename,
              MAX_PATH - dirlen);
#else
    strncpy(&path[dirlen], info.m_filename, MAX_PATH - dirlen);
#endif
    if (mkpath(path) < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file, 0x40
                               // is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MAX_PATH ||
          !mz_zip_reader_extract_to_mem_no_alloc(&zip_archive, i, symlink_to,
                                                 MAX_PATH, 0, NULL, 0)) {
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(&zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(&zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          goto out;
        }
      }

#if defined(_MSC_VER)
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0) {
        if (chmod(path, (mode_t)xattr) < 0) {
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }
  status = 0;

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(&zip_archive)) {
    // Cannot end zip reader
    status = -1;
  }

  return status;
}